

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CompactReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  pointer pcVar2;
  bool bVar3;
  long *local_40;
  Colour colour;
  long local_30 [2];
  
  bVar3 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar3) {
    local_40 = (long *)((ulong)local_40 & 0xffffffffffffff00);
    Colour::use(FileName);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream," for: ",6);
    Colour::use(None);
    poVar1 = this->stream;
    pcVar2 = (this->result->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar2,
               pcVar2 + (this->result->m_resultData).reconstructedExpression._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,_colour);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    {
                        Colour colour( dimColour() );
                        stream << " for: ";
                    }
                    stream << result.getExpandedExpression();
                }
            }